

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O1

__pid_t __thiscall TadsMessageQueue::wait(TadsMessageQueue *this,void *__stat_loc)

{
  int iVar1;
  int iVar2;
  TadsMessage *pTVar3;
  undefined8 *in_RDX;
  OS_Waitable *w [3];
  OS_Waitable *local_38 [4];
  
  *in_RDX = 0;
  local_38[0] = &this->ev->super_OS_Waitable;
  if (this->ev == (OS_Event *)0x0) {
    local_38[0] = (OS_Waitable *)0x0;
  }
  if (this->quit_evt == (OS_Event *)0x0) {
    iVar1 = 1;
  }
  else {
    local_38[1] = &this->quit_evt->super_OS_Waitable;
    iVar1 = 2;
  }
  iVar1 = OS_Waitable::multi_wait(iVar1,local_38,(unsigned_long)__stat_loc);
  if (iVar1 == 0) {
    pTVar3 = get(this);
    *in_RDX = pTVar3;
  }
  iVar2 = 2;
  if (local_38[iVar1] != (OS_Waitable *)0x0) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int TadsMessageQueue::wait(VMG_ unsigned long timeout, TadsMessage **msgp)
{
    /* assume we won't return a message */
    *msgp = 0;

    /* 
     *   Wait for a message to arrive in the queue.  The sender will signal
     *   our event upon posting a message.  Note that our assumption that
     *   there's only one reader thread per queue means that we don't have to
     *   worry about another reader swiping the signaled message between the
     *   time the signal went off and the time we read the queue.
     *   
     *   Also stop waiting if the quit event has been signaled, or the debug
     *   event is signaled.  
     */
    OS_Waitable *w[3];
    int cnt = 0;
    w[cnt++] = ev;

    /* add the quit event, if present */
    if (quit_evt != 0)
        w[cnt++] = quit_evt;

    /* add the debug break event, if present */
    OS_Event *brkevt = 0;
    VM_IF_DEBUGGER(if (G_debugger != 0)
        w[cnt++] = brkevt = G_debugger->get_break_event());
    
    /* wait for an event */
    int ret = OS_Waitable::multi_wait(cnt, w, timeout);
    
    /* if the message event fired, retrieve the message */
    if (ret == OSWAIT_EVENT + 0)
        *msgp = get();
    
    /* 
     *   always return +2 for the debug event (we'll have +1 from the
     *   multi_wait if the list doesn't have a quit event) 
     */
    if (w[ret - OSWAIT_EVENT] == brkevt)
        ret = OSWAIT_EVENT + 2;

    /* release the debugger break event, if we got it */
    if (brkevt != 0)
        brkevt->release_ref();
    
    /* return the result */
    return ret;
}